

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O2

int fits_rcomp_short(short *a,int nx,uchar *c,int clen,int nblock)

{
  short sVar1;
  void *__ptr;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  short sVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  Buffer_t *pBVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  uint local_7c;
  Buffer local_78;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_78.end = c + clen;
  lVar14 = (long)nblock;
  local_78.start = c;
  local_78.current = c;
  __ptr = malloc(lVar14 * 4);
  iVar5 = -1;
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
  }
  else {
    local_78.bitbuffer = 0;
    local_78.bits_to_go = 8;
    output_nbits(&local_78,(int)*a,0x10);
    sVar9 = *a;
    local_48 = (long)nx;
    local_58 = lVar14 * 2;
    lVar10 = 0;
    local_7c = nblock;
    local_50 = lVar14;
    while (lVar14 = local_48 - lVar10, lVar14 != 0 && lVar10 <= local_48) {
      if (lVar14 < local_50) {
        local_7c = (uint)lVar14;
      }
      uVar15 = 0;
      if (0 < (int)local_7c) {
        uVar15 = (ulong)local_7c;
      }
      dVar16 = 0.0;
      for (uVar2 = 0; uVar15 != uVar2; uVar2 = uVar2 + 1) {
        sVar1 = a[uVar2];
        iVar5 = (int)(short)(sVar1 - sVar9);
        uVar6 = iVar5 >> 0xf ^ iVar5 * 2;
        *(uint *)((long)__ptr + uVar2 * 4) = uVar6;
        dVar16 = dVar16 + (double)(int)uVar6;
        sVar9 = sVar1;
      }
      dVar18 = ((dVar16 - (double)((int)local_7c / 2)) + -1.0) / (double)(int)local_7c;
      dVar17 = 0.0;
      if (0.0 <= dVar18) {
        dVar17 = dVar18;
      }
      uVar8 = 0;
      for (uVar6 = (uint)dVar17; 1 < (ushort)uVar6; uVar6 = (uVar6 & 0xffff) >> 1) {
        uVar8 = uVar8 + 1;
      }
      local_40 = lVar10;
      if (uVar8 < 0xe) {
        if (((uVar8 != 0) || (dVar16 != 0.0)) || (NAN(dVar16))) {
          output_nbits(&local_78,uVar8 + 1,4);
          bVar3 = (byte)uVar8;
          uVar2 = local_78._0_8_ & 0xffffffff;
          local_38 = (ulong)-uVar8;
          iVar5 = local_78.bits_to_go;
          for (uVar11 = 0; iVar4 = (int)uVar2, uVar11 != uVar15; uVar11 = uVar11 + 1) {
            uVar6 = *(uint *)((long)__ptr + uVar11 * 4);
            iVar12 = (int)uVar6 >> (bVar3 & 0x1f);
            iVar7 = iVar12 - iVar5;
            if (iVar12 < iVar5) {
              uVar2 = (ulong)(iVar4 << ((byte)(iVar12 + 1) & 0x1f) | 1);
              iVar5 = iVar5 - (iVar12 + 1);
            }
            else {
              *local_78.current = (uchar)(iVar4 << ((byte)iVar5 & 0x1f));
              for (; local_78.current = local_78.current + 1, 7 < iVar7; iVar7 = iVar7 + -8) {
                *local_78.current = '\0';
              }
              iVar5 = 7 - iVar7;
              uVar2 = 1;
            }
            if (uVar8 != 0) {
              uVar6 = uVar6 & ~(-1 << (bVar3 & 0x1f)) | (int)uVar2 << (bVar3 & 0x1f);
              uVar2 = (ulong)uVar6;
              iVar4 = uVar8 - iVar5;
              for (iVar5 = iVar5 + -uVar8; iVar5 < 1; iVar5 = iVar5 + 8) {
                *local_78.current = (uchar)((int)uVar6 >> ((byte)iVar4 & 0x1f));
                local_78.current = local_78.current + 1;
                iVar4 = iVar4 + -8;
              }
            }
          }
          if (local_78.end < local_78.current) {
            ffpmsg("rice_encode: end of buffer");
            free(__ptr);
            return -1;
          }
          local_78.bits_to_go = iVar5;
          local_78.bitbuffer = iVar4;
        }
        else {
          output_nbits(&local_78,0,4);
        }
      }
      else {
        output_nbits(&local_78,0xf,4);
        for (uVar2 = 0; uVar15 != uVar2; uVar2 = uVar2 + 1) {
          output_nbits(&local_78,*(int *)((long)__ptr + uVar2 * 4),0x10);
        }
      }
      a = (short *)((long)a + local_58);
      lVar10 = local_40 + local_50;
    }
    pBVar13 = local_78.current;
    if (local_78.bits_to_go < 8) {
      *local_78.current = (uchar)(local_78.bitbuffer << ((byte)local_78.bits_to_go & 0x1f));
      pBVar13 = local_78.current + 1;
    }
    free(__ptr);
    iVar5 = (int)pBVar13 - (int)local_78.start;
  }
  return iVar5;
}

Assistant:

int fits_rcomp_short(
	  short a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
short pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned short psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 2; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 4;
    fsmax = 14;
    
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first short value to the first 2 bytes of the buffer */
    if (output_nbits(buffer, a[0], 16) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned short) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
/* case3++; */
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
/* case1++; */
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
/* case2++; */
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}